

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

void object_skin_display(menu_conflict *menu,int cursor,int *top,region_conflict *loc)

{
  wchar_t x;
  int iVar1;
  int iVar2;
  int local_4c;
  int local_48;
  int local_44;
  int local_3c;
  _Bool is_curs;
  int i;
  int n;
  int rows_per_page;
  int row;
  int col;
  region_conflict *loc_local;
  int *top_local;
  int cursor_local;
  menu_conflict *menu_local;
  
  x = loc->col;
  iVar1 = loc->row;
  iVar2 = loc->page_rows;
  if (menu->filter_list == (int *)0x0) {
    local_44 = menu->count;
  }
  else {
    local_44 = menu->filter_count;
  }
  if ((cursor <= *top) && (0 < *top)) {
    *top = cursor + -1;
  }
  if (*top + iVar2 + -1 <= cursor) {
    *top = (cursor - (iVar2 + -1)) + 1;
  }
  if (local_44 - iVar2 < *top) {
    local_48 = local_44 - iVar2;
  }
  else {
    local_48 = *top;
  }
  *top = local_48;
  if (*top < 0) {
    local_4c = 0;
  }
  else {
    local_4c = *top;
  }
  *top = local_4c;
  for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
    Term_erase(x,iVar1 + local_3c,loc->width);
    if (local_3c < local_44) {
      display_menu_row(menu,local_3c + *top,*top,local_3c == cursor - *top,iVar1 + local_3c,x,
                       loc->width);
    }
  }
  if (-1 < menu->cursor) {
    Term_gotoxy(x + menu->cursor_x_offset,(iVar1 + cursor) - *top);
  }
  return;
}

Assistant:

static void object_skin_display(struct menu *menu, int cursor, int *top, region *loc)
{
	int col = loc->col;
	int row = loc->row;
	int rows_per_page = loc->page_rows;
	int n = menu->filter_list ? menu->filter_count : menu->count;
	int i;

	/* Keep a certain distance from the top when possible */
	if ((cursor <= *top) && (*top > 0))
		*top = cursor - 1;

	/* Keep a certain distance from the bottom when possible */
	if (cursor >= *top + (rows_per_page - 1))
		*top = cursor - (rows_per_page - 1) + 1;

	/* Limit the top to legal places */
	*top = MIN(*top, n - rows_per_page);
	*top = MAX(*top, 0);

	for (i = 0; i < rows_per_page; i++) {
		/* Blank all lines */
		Term_erase(col, row + i, loc->width);
		if (i < n) {
			/* Redraw the line if it's within the number of menu items */
			bool is_curs = (i == cursor - *top);
			display_menu_row(menu, i + *top, *top, is_curs, row + i, col,
							loc->width);
		}
	}

	if (menu->cursor >= 0)
		Term_gotoxy(col + menu->cursor_x_offset, row + cursor - *top);
}